

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

int parse_tdp_token_chain(simple_token *chain)

{
  simple_token *yyminor;
  simple_token *psVar1;
  simple_token *psVar2;
  void *yyp;
  int iVar3;
  simple_token *result;
  simple_token *local_38;
  
  yyp = TDPParseAlloc(malloc);
  yyminor = chain->next;
  local_38 = (simple_token *)0x0;
  fputc(10,_stderr);
  TDPParseTrace((FILE *)_stderr,"parser >>");
  if (yyminor != (simple_token *)0x0) {
    psVar1 = yyminor->next;
    yyminor->next = (simple_token *)0x0;
    yyminor->tail = yyminor;
    while (psVar1 != (simple_token *)0x0) {
      psVar1->prev = (simple_token *)0x0;
      TDPParse(yyp,(uint)yyminor->type,yyminor,&local_38);
      psVar2 = psVar1->next;
      psVar1->next = (simple_token *)0x0;
      psVar1->tail = psVar1;
      yyminor = psVar1;
      psVar1 = psVar2;
    }
    TDPParse(yyp,(uint)yyminor->type,yyminor,&local_38);
  }
  iVar3 = 0;
  TDPParse(yyp,0,(simple_token *)0x0,&local_38);
  TDPParseFree(yyp,free);
  if (local_38 == (simple_token *)0x0) {
    iVar3 = -1;
  }
  else {
    chain->next = (simple_token *)0x0;
    chain->child = local_38;
  }
  return iVar3;
}

Assistant:

int parse_tdp_token_chain(simple_token * chain) {

	// Parser
	void * pParser = TDPParseAlloc (malloc);
	simple_token * walker = chain->next;
	simple_token * remainder;

	simple_token * result = NULL;

#ifndef NDEBUG
	fprintf(stderr, "\n");
	TDPParseTrace(stderr, "parser >>");
#endif

	while (walker != NULL) {
		remainder = walker->next;

		// Snip token from remainder
		walker->next = NULL;
		walker->tail = walker;

		if (remainder) {
			remainder->prev = NULL;
		}

		TDPParse(pParser, walker->type, walker, &result);

		walker = remainder;
	}

	// Signal that we're done
	TDPParse(pParser, 0, NULL, &result);

	TDPParseFree(pParser, free);

	if (result) {
		// Success
		chain->next = NULL;
		chain->child = result;
		return 0;
	} else {
		// Failed
		return -1;
	}
}